

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O3

bool __thiscall miniros::master::NetAdapter::hasAccessTo(NetAdapter *this,HostInfo *host)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  
  p_Var2 = (host->addresses)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(host->addresses)._M_t._M_impl.super__Rb_tree_header) {
      return false;
    }
    bVar1 = network::NetAddress::isLocal((NetAddress *)(p_Var2 + 1));
    if ((!bVar1) && (bVar1 = matchNetAddress(this,(NetAddress *)(p_Var2 + 1)), bVar1)) break;
    p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2);
  }
  return true;
}

Assistant:

bool NetAdapter::hasAccessTo(const HostInfo& host) const
{
  for (const auto& address: host.addresses) {
    if (address.isLocal())
      continue;
    if (matchNetAddress(address))
      return true;
  }
  return false;
}